

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

glist_t fsg_model_trans(fsg_model_t *fsg,int32 i,int32 j)

{
  hash_table_t *h;
  int32 iVar1;
  void *val;
  int32 local_c;
  glist_t local_8;
  
  h = fsg->trans[i].trans;
  if ((h == (hash_table_t *)0x0) ||
     (local_c = j, iVar1 = hash_table_lookup_bkey(h,(char *)&local_c,4,&local_8), iVar1 < 0)) {
    local_8 = (glist_t)0x0;
  }
  return local_8;
}

Assistant:

glist_t
fsg_model_trans(fsg_model_t * fsg, int32 i, int32 j)
{
    void *val;

    if (fsg->trans[i].trans == NULL)
        return NULL;
    if (hash_table_lookup_bkey(fsg->trans[i].trans, (char const *) &j,
                               sizeof(j), &val) < 0)
        return NULL;
    return (glist_t) val;
}